

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_push(iterator *this,iter_result *e,read_critical_section *rcs)

{
  node_type nVar1;
  node_type node_type;
  read_critical_section *rcs_local;
  iter_result *e_local;
  iterator *this_local;
  
  nVar1 = detail::basic_node_ptr<unodb::detail::olc_node_header>::type(&e->node);
  if (nVar1 == LEAF) {
    this_local._7_1_ = try_push_leaf(this,(olc_node_ptr)(e->node).tagged_ptr,rcs);
  }
  else {
    this_local._7_1_ =
         try_push(this,(olc_node_ptr)(e->node).tagged_ptr,e->key_byte,e->child_index,e->prefix,rcs);
  }
  return this_local._7_1_;
}

Assistant:

bool try_push(const typename inode_base::iter_result& e,
                  const optimistic_lock::read_critical_section& rcs) {
      const auto node_type = e.node.type();
      if (UNODB_DETAIL_UNLIKELY(node_type == node_type::LEAF)) {
        return try_push_leaf(e.node, rcs);
      }
      return try_push(e.node, e.key_byte, e.child_index, e.prefix, rcs);
    }